

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint Kit_DsdGetSupports_rec(Kit_DsdNtk_t *p,int iLit)

{
  int Id;
  uint uVar1;
  Kit_DsdObj_t *pKVar2;
  uint local_30;
  int iFaninLit;
  uint k;
  uint uSupport;
  Kit_DsdObj_t *pObj;
  int iLit_local;
  Kit_DsdNtk_t *p_local;
  
  Id = Abc_Lit2Var(iLit);
  pKVar2 = Kit_DsdNtkObj(p,Id);
  if (pKVar2 == (Kit_DsdObj_t *)0x0) {
    p_local._4_4_ = Kit_DsdLitSupport(p,iLit);
  }
  else {
    iFaninLit = 0;
    for (local_30 = 0; local_30 < (uint)*pKVar2 >> 0x1a; local_30 = local_30 + 1) {
      uVar1 = Kit_DsdGetSupports_rec
                        (p,(uint)*(ushort *)(&pKVar2[1].field_0x0 + (ulong)local_30 * 2));
      iFaninLit = uVar1 | iFaninLit;
    }
    p->pSupps[(int)(((uint)*pKVar2 & 0x3f) - (uint)p->nVars)] = iFaninLit;
    if (0xffff < (uint)iFaninLit) {
      __assert_fail("uSupport <= 0xFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x6d4,"unsigned int Kit_DsdGetSupports_rec(Kit_DsdNtk_t *, int)");
    }
    p_local._4_4_ = iFaninLit;
  }
  return p_local._4_4_;
}

Assistant:

unsigned Kit_DsdGetSupports_rec( Kit_DsdNtk_t * p, int iLit )
{
    Kit_DsdObj_t * pObj;
    unsigned uSupport, k;
    int iFaninLit;
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return Kit_DsdLitSupport( p, iLit );
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        uSupport |= Kit_DsdGetSupports_rec( p, iFaninLit );
    p->pSupps[pObj->Id - p->nVars] = uSupport;
    assert( uSupport <= 0xFFFF );
    return uSupport;
}